

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

void __thiscall CLParserTestShowIncludes::Run(CLParserTestShowIncludes *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  CLParserTestShowIncludes *local_10;
  CLParserTestShowIncludes *this_local;
  
  pTVar1 = g_current_test;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  CLParser::FilterShowIncludes(&local_30,&local_50,&local_88);
  bVar2 = std::operator==("",&local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                     ,0x17,"\"\" == CLParser::FilterShowIncludes(\"\", \"\")");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar1 = g_current_test;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Sample compiler output",&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
    CLParser::FilterShowIncludes(&local_b0,&local_d0,&local_f8);
    bVar2 = std::operator==("",&local_b0);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                       ,0x19,
                       "\"\" == CLParser::FilterShowIncludes(\"Sample compiler output\", \"\")");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    pTVar1 = g_current_test;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"Note: including file: c:\\Some Files\\foobar.h",&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
      CLParser::FilterShowIncludes(&local_120,&local_140,&local_168);
      bVar2 = std::operator==("c:\\Some Files\\foobar.h",&local_120);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                         ,0x1c,
                         "\"c:\\\\Some Files\\\\foobar.h\" == CLParser::FilterShowIncludes(\"Note: including file: \" \"c:\\\\Some Files\\\\foobar.h\", \"\")"
                        );
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      pTVar1 = g_current_test;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"Note: including file:    c:\\initspaces.h",&local_1b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1d9);
        CLParser::FilterShowIncludes(&local_190,&local_1b0,&local_1d8);
        bVar2 = std::operator==("c:\\initspaces.h",&local_190);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                           ,0x1f,
                           "\"c:\\\\initspaces.h\" == CLParser::FilterShowIncludes(\"Note: including file:    \" \"c:\\\\initspaces.h\", \"\")"
                          );
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator(&local_1d9);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator(&local_1b1);
        pTVar1 = g_current_test;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_220,"Non-default prefix: inc file:    c:\\initspaces.h",
                     &local_221);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"Non-default prefix: inc file:",&local_249);
          CLParser::FilterShowIncludes(&local_200,&local_220,&local_248);
          bVar2 = std::operator==("c:\\initspaces.h",&local_200);
          bVar2 = testing::Test::Check
                            (pTVar1,bVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                             ,0x23,
                             "\"c:\\\\initspaces.h\" == CLParser::FilterShowIncludes(\"Non-default prefix: inc file:    \" \"c:\\\\initspaces.h\", \"Non-default prefix: inc file:\")"
                            );
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator(&local_221);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            testing::Test::AddAssertionFailure(g_current_test);
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST(CLParserTest, ShowIncludes) {
  ASSERT_EQ("", CLParser::FilterShowIncludes("", ""));

  ASSERT_EQ("", CLParser::FilterShowIncludes("Sample compiler output", ""));
  ASSERT_EQ("c:\\Some Files\\foobar.h",
            CLParser::FilterShowIncludes("Note: including file: "
                                         "c:\\Some Files\\foobar.h", ""));
  ASSERT_EQ("c:\\initspaces.h",
            CLParser::FilterShowIncludes("Note: including file:    "
                                         "c:\\initspaces.h", ""));
  ASSERT_EQ("c:\\initspaces.h",
            CLParser::FilterShowIncludes("Non-default prefix: inc file:    "
                                         "c:\\initspaces.h",
                    "Non-default prefix: inc file:"));
}